

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.c
# Opt level: O0

int scan_buffer(d_loc_t *aloc,D_State *parse_state,ShiftResult *results)

{
  uchar uVar1;
  char cVar2;
  short sVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  ushort uVar11;
  uint uVar12;
  bool bVar13;
  char *end;
  int longest;
  uint32 so_2;
  uint32 sb_2;
  uint uStack_f0;
  uint8 c_2;
  uint32 prev_2;
  uint32 last_2;
  uint32 state_2;
  SB_trans_uint32 *tst_2;
  SB_uint32 *st_2;
  uint32 so_1;
  uint32 sb_1;
  uint8 c_1;
  uint16 prev_1;
  uint16 last_1;
  uint16 state_1;
  SB_trans_uint16 *tst_1;
  SB_uint16 *st_1;
  uint32 so;
  uint32 sb;
  uint8 c;
  uint8 prev;
  uint8 last;
  uint8 state;
  SB_trans_uint8 *tst;
  SB_uint8 *st;
  D_Shift **shift_diff;
  D_Shift **shift;
  int local_80;
  int j;
  int i;
  int nresults;
  int line;
  int col;
  char *s;
  d_loc_t last_loc;
  d_loc_t loc;
  ShiftResult *results_local;
  D_State *parse_state_local;
  d_loc_t *aloc_local;
  
  last_loc._24_8_ = aloc->s;
  pcVar7 = aloc->pathname;
  pcVar8 = aloc->ws;
  pcVar9 = *(char **)&aloc->col;
  s = aloc->s;
  last_loc.s = aloc->pathname;
  last_loc.pathname = aloc->ws;
  last_loc.ws = *(char **)&aloc->col;
  loc.ws._0_4_ = (int)pcVar9;
  nresults = (int)loc.ws;
  loc.ws._4_4_ = (int)((ulong)pcVar9 >> 0x20);
  i = loc.ws._4_4_;
  j = 0;
  local_80 = 0;
  shift_diff = (D_Shift **)0x0;
  uVar1 = parse_state->scanner_size;
  loc.ws = pcVar9;
  if (uVar1 == '\x01') {
    pvVar5 = parse_state->scanner_table;
    pvVar6 = parse_state->transition_table;
    so._3_1_ = 0;
    so._2_1_ = 0;
    so._0_1_ = *(byte *)last_loc._24_8_;
    while( true ) {
      _line = (byte *)(last_loc._24_8_ + 1);
      cVar2 = *(char *)(*(long *)((long)pvVar5 +
                                 (ulong)(uint)((int)(uint)(byte)so >> 6) * 8 +
                                 (ulong)so._3_1_ * 0x28 + 8) + (ulong)((byte)so & 0x3f));
      if (cVar2 == '\0') break;
      bVar10 = cVar2 - 1;
      if ((so._3_1_ != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        for (st = (SB_uint8 *)
                  parse_state->accepts_diff
                  [*(byte *)(*(long *)((long)pvVar6 +
                                      (ulong)(uint)((int)(uint)(byte)so >> 6) * 8 +
                                      (ulong)so._3_1_ * 0x20) + (ulong)((byte)so & 0x3f))];
            st->shift != (D_Shift **)0x0; st = (SB_uint8 *)st->scanner_block) {
          results[j].loc.s = (char *)last_loc._24_8_;
          results[j].loc.pathname = pcVar7;
          results[j].loc.ws = pcVar8;
          *(char **)&results[j].loc.col = loc.ws;
          results[j].shift = (D_Shift *)st->shift;
          j = j + 1;
        }
      }
      if ((byte)so == 10) {
        i = i + 1;
        nresults = 0;
      }
      else {
        nresults = nresults + 1;
      }
      last_loc._24_8_ = _line;
      loc.ws = (char *)CONCAT44(i,nresults);
      if (*(long *)((long)pvVar5 + (ulong)bVar10 * 0x28) != 0) {
        s = (char *)_line;
        last_loc.ws = loc.ws;
        so._2_1_ = bVar10;
        last_loc.s = pcVar7;
        last_loc.pathname = pcVar8;
      }
      so._0_1_ = *_line;
      so._3_1_ = bVar10;
    }
    shift_diff = *(D_Shift ***)((long)pvVar5 + (ulong)so._2_1_ * 0x28);
  }
  else if (uVar1 == '\x02') {
    pvVar5 = parse_state->scanner_table;
    pvVar6 = parse_state->transition_table;
    sb_1._2_2_ = 0;
    sb_1._0_2_ = 0;
    so_1._1_1_ = *(byte *)last_loc._24_8_;
    while( true ) {
      _line = (byte *)(last_loc._24_8_ + 1);
      sVar3 = *(short *)(*(long *)((long)pvVar5 +
                                  (ulong)(uint)((int)(uint)so_1._1_1_ >> 6) * 8 +
                                  (ulong)sb_1._2_2_ * 0x28 + 8) + (ulong)(so_1._1_1_ & 0x3f) * 2);
      if (sVar3 == 0) break;
      uVar11 = sVar3 - 1;
      if ((sb_1._2_2_ != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        for (st = (SB_uint8 *)
                  parse_state->accepts_diff
                  [*(ushort *)
                    (*(long *)((long)pvVar6 +
                              (ulong)(uint)((int)(uint)so_1._1_1_ >> 6) * 8 +
                              (ulong)sb_1._2_2_ * 0x20) + (ulong)(so_1._1_1_ & 0x3f) * 2)];
            st->shift != (D_Shift **)0x0; st = (SB_uint8 *)st->scanner_block) {
          results[j].loc.s = (char *)last_loc._24_8_;
          results[j].loc.pathname = pcVar7;
          results[j].loc.ws = pcVar8;
          *(char **)&results[j].loc.col = loc.ws;
          results[j].shift = (D_Shift *)st->shift;
          j = j + 1;
        }
      }
      last_loc._24_8_ = _line;
      loc.ws = (char *)CONCAT44(i,nresults);
      if (*(long *)((long)pvVar5 + (ulong)uVar11 * 0x28) != 0) {
        s = (char *)_line;
        last_loc.ws = loc.ws;
        sb_1._0_2_ = uVar11;
        last_loc.s = pcVar7;
        last_loc.pathname = pcVar8;
      }
      if (so_1._1_1_ == 10) {
        i = i + 1;
        nresults = 0;
      }
      else {
        nresults = nresults + 1;
      }
      so_1._1_1_ = *_line;
      sb_1._2_2_ = uVar11;
    }
    shift_diff = *(D_Shift ***)((long)pvVar5 + (ulong)(ushort)sb_1 * 0x28);
  }
  else if (uVar1 == '\x04') {
    pvVar5 = parse_state->scanner_table;
    pvVar6 = parse_state->transition_table;
    prev_2 = 0;
    uStack_f0 = 0;
    so_2._3_1_ = *(byte *)last_loc._24_8_;
    while( true ) {
      _line = (byte *)(last_loc._24_8_ + 1);
      iVar4 = *(int *)(*(long *)((long)pvVar5 +
                                (ulong)(uint)((int)(uint)so_2._3_1_ >> 6) * 8 +
                                (ulong)prev_2 * 0x28 + 8) + (ulong)(so_2._3_1_ & 0x3f) * 4);
      if (iVar4 == 0) break;
      uVar12 = iVar4 - 1;
      if ((prev_2 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) {
        for (st = (SB_uint8 *)
                  parse_state->accepts_diff
                  [*(uint *)(*(long *)((long)pvVar6 +
                                      (ulong)(uint)((int)(uint)so_2._3_1_ >> 6) * 8 +
                                      (ulong)prev_2 * 0x20) + (ulong)(so_2._3_1_ & 0x3f) * 4)];
            st->shift != (D_Shift **)0x0; st = (SB_uint8 *)st->scanner_block) {
          results[j].loc.s = (char *)last_loc._24_8_;
          results[j].loc.pathname = pcVar7;
          results[j].loc.ws = pcVar8;
          *(char **)&results[j].loc.col = loc.ws;
          results[j].shift = (D_Shift *)st->shift;
          j = j + 1;
        }
      }
      last_loc._24_8_ = _line;
      loc.ws = (char *)CONCAT44(i,nresults);
      if (*(long *)((long)pvVar5 + (ulong)uVar12 * 0x28) != 0) {
        s = (char *)_line;
        last_loc.ws = loc.ws;
        uStack_f0 = uVar12;
        last_loc.s = pcVar7;
        last_loc.pathname = pcVar8;
      }
      if (so_2._3_1_ == 10) {
        i = i + 1;
        nresults = 0;
      }
      else {
        nresults = nresults + 1;
      }
      so_2._3_1_ = *_line;
      prev_2 = uVar12;
    }
    shift_diff = *(D_Shift ***)((long)pvVar5 + (ulong)uStack_f0 * 0x28);
  }
  if (shift_diff != (D_Shift **)0x0) {
    for (; *shift_diff != (D_Shift *)0x0; shift_diff = shift_diff + 1) {
      results[j].loc.s = s;
      results[j].loc.pathname = last_loc.s;
      results[j].loc.ws = last_loc.pathname;
      *(char **)&results[j].loc.col = last_loc.ws;
      results[j].shift = *shift_diff;
      j = j + 1;
    }
  }
  if (j != 0) {
    pcVar7 = results[j + -1].loc.s;
    bVar13 = parse_state->scan_kind == '\x01';
    iVar4 = j;
    if (parse_state->scan_kind == '\x02') {
      while ((local_80 = iVar4 + -1, -1 < local_80 && (pcVar7 <= results[local_80].loc.s))) {
        iVar4 = local_80;
        if ((results[local_80].shift)->shift_kind == '\x01') {
          bVar13 = true;
        }
      }
    }
    if (bVar13) {
      local_80 = 0;
      for (shift._4_4_ = 0; shift._4_4_ < j; shift._4_4_ = shift._4_4_ + 1) {
        if ((results[shift._4_4_].loc.s == pcVar7) ||
           ((results[shift._4_4_].shift)->shift_kind == '\x03')) {
          if (local_80 != shift._4_4_) {
            memcpy(results + local_80,results + shift._4_4_,0x30);
          }
          local_80 = local_80 + 1;
        }
      }
      j = local_80;
    }
    else if (parse_state->scan_kind == '\x02') {
      for (shift._4_4_ = local_80; -1 < shift._4_4_; shift._4_4_ = shift._4_4_ + -1) {
        if ((results[shift._4_4_].shift)->shift_kind != '\x01') {
          if (local_80 != shift._4_4_) {
            memcpy(results + local_80,results + shift._4_4_,0x30);
          }
          local_80 = local_80 + -1;
        }
      }
      j = (j - local_80) + -1;
      if (local_80 != -1) {
        memmove(results,results + (local_80 + 1),(long)j * 0x30);
      }
    }
  }
  return j;
}

Assistant:

int scan_buffer(d_loc_t *aloc, D_State *parse_state, ShiftResult *results) {
  d_loc_t loc = *aloc, last_loc = *aloc;
  char *s = loc.s;
  int col = loc.col, line = loc.line;
  int nresults = 0, i = 0, j;
  D_Shift **shift = NULL, **shift_diff = 0;

  switch (parse_state->scanner_size) {
    case 1: {
      /* all matches */
      SB_uint8 *st = (SB_uint8 *)parse_state->scanner_table;
      SB_trans_uint8 *tst = (SB_trans_uint8 *)parse_state->transition_table;
      uint8 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 2: {
      /* all matches */
      SB_uint16 *st = (SB_uint16 *)parse_state->scanner_table;
      SB_trans_uint16 *tst = (SB_trans_uint16 *)parse_state->transition_table;
      uint16 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 4: {
      /* all matches */
      SB_uint32 *st = (SB_uint32 *)parse_state->scanner_table;
      SB_trans_uint32 *tst = (SB_trans_uint32 *)parse_state->transition_table;
      uint32 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
  }
  if (shift) {
    for (; *shift; shift++) {
      results[nresults].loc = last_loc;
      results[nresults++].shift = *shift;
    }
  }
  if (nresults) {
    int longest = 0;
    char *end = results[nresults - 1].loc.s;
    if (parse_state->scan_kind == D_SCAN_LONGEST) longest = 1;
    if (parse_state->scan_kind == D_SCAN_MIXED) {
      for (i = nresults - 1; i >= 0; i--) {
        if (results[i].loc.s < end) break;
        if (results[i].shift->shift_kind == D_SCAN_LONGEST) longest = 1;
      }
    }
    if (longest) {
      /* keep only 'longest' */
      i = 0;
      for (j = 0; j < nresults; j++) {
        if (results[j].loc.s == end || results[j].shift->shift_kind == D_SCAN_TRAILING) {
          if (i != j) results[i] = results[j];
          i++;
        }
      }
      nresults = i;
    } else if (parse_state->scan_kind == D_SCAN_MIXED) {
      /* only keep non-longest */
      for (j = i; j >= 0; j--)
        if (results[j].shift->shift_kind != D_SCAN_LONGEST) {
          if (i != j) results[i] = results[j];
          i--;
        }
      nresults = nresults - i - 1;
      if (i != -1) memmove(&results[0], &results[i + 1], nresults * sizeof(results[0]));
    }
  }
  return nresults;
}